

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deprecation-warning.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  string filename;
  string replacement_filename;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"main",(allocator<char> *)&replacement_filename);
  if (0 < argc) {
    std::__cxx11::string::assign((char *)&filename);
  }
  lVar2 = std::__cxx11::string::find_last_of((char *)&filename,0x102009);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&replacement_filename,(ulong)&filename);
    std::__cxx11::string::operator=((string *)&filename,(string *)&replacement_filename);
    std::__cxx11::string::~string((string *)&replacement_filename);
  }
  std::operator+(&replacement_filename,"whisper-",&filename);
  bVar1 = std::operator==(&filename,"main");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&replacement_filename);
  }
  bVar1 = std::operator==(&filename,"main.exe");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&replacement_filename);
  }
  fputc(10,_stdout);
  fprintf(_stdout,"WARNING: The binary \'%s\' is deprecated.\n",filename._M_dataplus._M_p);
  fprintf(_stdout," Please use \'%s\' instead.\n",replacement_filename._M_dataplus._M_p);
  fwrite(" See https://github.com/ggerganov/whisper.cpp/tree/master/examples/deprecation-warning/README.md for more information.\n"
         ,0x77,1,_stdout);
  fputc(10,_stdout);
  std::__cxx11::string::~string((string *)&replacement_filename);
  std::__cxx11::string::~string((string *)&filename);
  return 1;
}

Assistant:

int main(int argc, char** argv) {
    std::string filename = "main";
    if (argc >= 1) {
        filename = argv[0];
    }

    // Get only the program name from the full path
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
        filename = filename.substr(pos+1);
    }

    // Append "whisper-" to the beginning of filename to get the replacemnt filename
    std::string replacement_filename = "whisper-" + filename;

    // The exception is if the filename is "main", then our replacement filename is "whisper-cli"
    if (filename == "main") {
        replacement_filename = "whisper-cli";
    }

    if (filename == "main.exe") {
        replacement_filename = "whisper-cli.exe";
    }

    fprintf(stdout, "\n");
    fprintf(stdout, "WARNING: The binary '%s' is deprecated.\n", filename.c_str());
    fprintf(stdout, " Please use '%s' instead.\n", replacement_filename.c_str());
    fprintf(stdout, " See https://github.com/ggerganov/whisper.cpp/tree/master/examples/deprecation-warning/README.md for more information.\n");
    fprintf(stdout, "\n");

    return EXIT_FAILURE;
}